

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O3

Value * __thiscall GlobOptBlockData::SetValue(GlobOptBlockData *this,Value *val,Opnd *opnd)

{
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  undefined4 *puVar4;
  char *message;
  char *error;
  uint lineNumber;
  
  if (opnd == (Opnd *)0x0) {
    return val;
  }
  OVar2 = IR::Opnd::GetKind(opnd);
  if (OVar2 == OpndKindReg) {
    OVar2 = IR::Opnd::GetKind(opnd);
    if (OVar2 == OpndKindReg) goto LAB_00493d62;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    error = "(this->IsRegOpnd())";
    message = "Bad call to AsRegOpnd()";
    lineNumber = 0x79;
  }
  else {
    if (OVar2 != OpndKindSym) {
      return val;
    }
    OVar2 = IR::Opnd::GetKind(opnd);
    if (OVar2 == OpndKindSym) goto LAB_00493d62;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    error = "(this->IsSymOpnd())";
    message = "Bad call to AsSymOpnd()";
    lineNumber = 0x45;
  }
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                     ,lineNumber,error,message);
  if (!bVar3) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar4 = 0;
LAB_00493d62:
  if ((Sym *)opnd[1]._vptr_Opnd != (Sym *)0x0) {
    SetValue(this,val,(Sym *)opnd[1]._vptr_Opnd);
  }
  return val;
}

Assistant:

Value *
GlobOptBlockData::SetValue(Value *val, IR::Opnd *opnd)
{
    if (opnd)
    {
        Sym *sym;
        switch (opnd->GetKind())
        {
        case IR::OpndKindSym:
            sym = opnd->AsSymOpnd()->m_sym;
            break;

        case IR::OpndKindReg:
            sym = opnd->AsRegOpnd()->m_sym;
            break;

        default:
            sym = nullptr;
        }
        if (sym)
        {
            this->SetValue(val, sym);
        }
    }

    return val;
}